

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void open_cb_simple(uv_fs_t *req)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uv_fs_t *extraout_RAX;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  __off64_t _Var7;
  uv_buf_t *bufs;
  char *pcVar8;
  uv_fs_t *puVar9;
  ulong uVar10;
  uv_fs_t *unaff_R14;
  long lVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uv_buf_t uVar15;
  char acStack_49a [2];
  uv_loop_t *puStack_498;
  uv_buf_t uStack_410;
  uv_buf_t uStack_400;
  uv_loop_t *puStack_3e8;
  uv_fs_t *puStack_3e0;
  uv_fs_t *puStack_3d8;
  uv_buf_t uStack_3a0;
  uv_buf_t uStack_390;
  uv_buf_t uStack_380;
  uv_buf_t uStack_370;
  char acStack_360 [256];
  char acStack_260 [256];
  char acStack_160 [128];
  char acStack_e0 [136];
  uv_loop_t *puStack_58;
  
  if (req->fs_type == UV_FS_OPEN) {
    puVar9 = (uv_fs_t *)req->result;
    if ((long)puVar9 < 0) goto LAB_0015de1c;
    open_cb_count = open_cb_count + 1;
    puVar9 = req;
    if (req->path != (char *)0x0) {
      uv_fs_req_cleanup(req);
      return;
    }
  }
  else {
    open_cb_simple_cold_1();
    puVar9 = extraout_RAX;
LAB_0015de1c:
    open_cb_simple_cold_3();
  }
  iVar2 = (int)puVar9;
  open_cb_simple_cold_2();
  fs_file_open_append(iVar2);
  fs_file_open_append(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_open_append_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_file_open_append_cold_1();
LAB_0015e1aa:
    fs_file_open_append_cold_2();
LAB_0015e1af:
    fs_file_open_append_cold_3();
LAB_0015e1b4:
    fs_file_open_append_cold_4();
LAB_0015e1b9:
    fs_file_open_append_cold_5();
LAB_0015e1be:
    fs_file_open_append_cold_6();
LAB_0015e1c3:
    fs_file_open_append_cold_7();
LAB_0015e1c8:
    fs_file_open_append_cold_8();
LAB_0015e1cd:
    fs_file_open_append_cold_9();
LAB_0015e1d2:
    fs_file_open_append_cold_10();
LAB_0015e1d7:
    fs_file_open_append_cold_11();
LAB_0015e1dc:
    fs_file_open_append_cold_12();
LAB_0015e1e1:
    fs_file_open_append_cold_13();
LAB_0015e1e6:
    fs_file_open_append_cold_14();
LAB_0015e1eb:
    fs_file_open_append_cold_15();
LAB_0015e1f0:
    fs_file_open_append_cold_16();
LAB_0015e1f5:
    fs_file_open_append_cold_17();
LAB_0015e1fa:
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015e1aa;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015e1af;
    if (write_req.result < 0) goto LAB_0015e1b4;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015e1b9;
    if (close_req.result != 0) goto LAB_0015e1be;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x402,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015e1c3;
    if (open_req1.result._4_4_ < 0) goto LAB_0015e1c8;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(test_buf,0xd);
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015e1cd;
    if (write_req.result < 0) goto LAB_0015e1d2;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015e1d7;
    if (close_req.result != 0) goto LAB_0015e1dc;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0x100,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015e1e1;
    if (open_req1.result._4_4_ < 0) goto LAB_0015e1e6;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(buf,0x20);
    iov = uVar15;
    uVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_0015e1eb;
    if (read_req.result != 0x1a) goto LAB_0015e1f0;
    auVar14[0] = -(buf[10] == 'r');
    auVar14[1] = -(buf[0xb] == '\n');
    auVar14[2] = -(buf[0xc] == '\0');
    auVar14[3] = -(buf[0xd] == 't');
    auVar14[4] = -(buf[0xe] == 'e');
    auVar14[5] = -(buf[0xf] == 's');
    auVar14[6] = -(buf[0x10] == 't');
    auVar14[7] = -(buf[0x11] == '-');
    auVar14[8] = -(buf[0x12] == 'b');
    auVar14[9] = -(buf[0x13] == 'u');
    auVar14[10] = -(buf[0x14] == 'f');
    auVar14[0xb] = -(buf[0x15] == 'f');
    auVar14[0xc] = -(buf[0x16] == 'e');
    auVar14[0xd] = -(buf[0x17] == 'r');
    auVar14[0xe] = -(buf[0x18] == '\n');
    auVar14[0xf] = -(buf[0x19] == '\0');
    auVar13[0] = -(buf[0] == 't');
    auVar13[1] = -(buf[1] == 'e');
    auVar13[2] = -(buf[2] == 's');
    auVar13[3] = -(buf[3] == 't');
    auVar13[4] = -(buf[4] == '-');
    auVar13[5] = -(buf[5] == 'b');
    auVar13[6] = -(buf[6] == 'u');
    auVar13[7] = -(buf[7] == 'f');
    auVar13[8] = -(buf[8] == 'f');
    auVar13[9] = -(buf[9] == 'e');
    auVar13[10] = -(buf[10] == 'r');
    auVar13[0xb] = -(buf[0xb] == '\n');
    auVar13[0xc] = -(buf[0xc] == '\0');
    auVar13[0xd] = -(buf[0xd] == 't');
    auVar13[0xe] = -(buf[0xe] == 'e');
    auVar13[0xf] = -(buf[0xf] == 's');
    auVar13 = auVar13 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e1f5;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015e1fa;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_open_append_cold_19();
  unlink("test_file");
  unlink("test_file2");
  loop = uv_default_loop();
  iVar4 = 0;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    run_test_fs_rename_to_existing_file_cold_1();
LAB_0015e54a:
    run_test_fs_rename_to_existing_file_cold_2();
LAB_0015e54f:
    run_test_fs_rename_to_existing_file_cold_3();
LAB_0015e554:
    run_test_fs_rename_to_existing_file_cold_4();
LAB_0015e559:
    run_test_fs_rename_to_existing_file_cold_5();
LAB_0015e55e:
    run_test_fs_rename_to_existing_file_cold_6();
LAB_0015e563:
    run_test_fs_rename_to_existing_file_cold_7();
LAB_0015e568:
    run_test_fs_rename_to_existing_file_cold_8();
LAB_0015e56d:
    run_test_fs_rename_to_existing_file_cold_9();
LAB_0015e572:
    run_test_fs_rename_to_existing_file_cold_10();
LAB_0015e577:
    run_test_fs_rename_to_existing_file_cold_11();
LAB_0015e57c:
    run_test_fs_rename_to_existing_file_cold_12();
LAB_0015e581:
    run_test_fs_rename_to_existing_file_cold_13();
LAB_0015e586:
    run_test_fs_rename_to_existing_file_cold_14();
LAB_0015e58b:
    run_test_fs_rename_to_existing_file_cold_15();
LAB_0015e590:
    run_test_fs_rename_to_existing_file_cold_16();
LAB_0015e595:
    run_test_fs_rename_to_existing_file_cold_17();
LAB_0015e59a:
    run_test_fs_rename_to_existing_file_cold_18();
LAB_0015e59f:
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015e54a;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015e54f;
    if (write_req.result < 0) goto LAB_0015e554;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015e559;
    if (close_req.result != 0) goto LAB_0015e55e;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015e563;
    if (open_req1.result._4_4_ < 0) goto LAB_0015e568;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015e56d;
    if (close_req.result != 0) goto LAB_0015e572;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015e577;
    if (rename_req.result != 0) goto LAB_0015e57c;
    uv_fs_req_cleanup(&rename_req);
    iVar4 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015e581;
    if (open_req1.result._4_4_ < 0) goto LAB_0015e586;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_0015e58b;
    if (read_req.result < 0) goto LAB_0015e590;
    iVar4 = 0x3120e0;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_0015e595;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015e59a;
    if (close_req.result != 0) goto LAB_0015e59f;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    unlink("test_file2");
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    iVar4 = (int)puVar5;
    if (iVar2 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  run_test_fs_rename_to_existing_file_cold_20();
  fs_read_bufs(iVar4);
  fs_read_bufs(iVar4);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  puStack_58 = puVar5;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_read_bufs_cold_1();
LAB_0015e855:
    fs_read_bufs_cold_2();
LAB_0015e85a:
    fs_read_bufs_cold_3();
LAB_0015e85f:
    fs_read_bufs_cold_4();
LAB_0015e864:
    fs_read_bufs_cold_5();
LAB_0015e869:
    fs_read_bufs_cold_6();
LAB_0015e86e:
    fs_read_bufs_cold_7();
LAB_0015e873:
    fs_read_bufs_cold_8();
LAB_0015e878:
    fs_read_bufs_cold_9();
LAB_0015e87d:
    fs_read_bufs_cold_10();
LAB_0015e882:
    fs_read_bufs_cold_11();
LAB_0015e887:
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015e855;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015e85a;
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,1,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015e85f;
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_3a0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015e864;
    uStack_3a0 = uv_buf_init(acStack_360,0x100);
    uStack_390 = uv_buf_init(acStack_260,0x100);
    uStack_380 = uv_buf_init(acStack_160,0x80);
    uStack_370 = uv_buf_init(acStack_e0,0x80);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_3a0,2,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0x1be) goto LAB_0015e869;
    if (read_req.result != 0x1be) goto LAB_0015e86e;
    unaff_R14 = &read_req;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_380,2,0x100,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0xbe) goto LAB_0015e873;
    if (read_req.result != 0xbe) goto LAB_0015e878;
    uv_fs_req_cleanup(&read_req);
    pcVar8 = uStack_390.base;
    pcVar12 = uStack_390.base;
    iVar2 = bcmp(uStack_390.base,uStack_380.base,0x80);
    iVar4 = (int)pcVar12;
    if (iVar2 != 0) goto LAB_0015e87d;
    pcVar8 = pcVar8 + 0x80;
    iVar2 = bcmp(pcVar8,uStack_370.base,0x3e);
    iVar4 = (int)pcVar8;
    if (iVar2 != 0) goto LAB_0015e882;
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015e887;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      return;
    }
  }
  fs_read_bufs_cold_13();
  fs_read_file_eof(iVar4);
  fs_read_file_eof(iVar4);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_read_file_eof_cold_1();
  puVar9 = (uv_fs_t *)0x1a3557;
  puStack_3d8 = (uv_fs_t *)0x15e8f2;
  unlink("test_file");
  puStack_3d8 = (uv_fs_t *)0x15e8f7;
  loop = uv_default_loop();
  iVar4 = 0;
  puStack_3d8 = (uv_fs_t *)0x15e91d;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    puStack_3d8 = (uv_fs_t *)0x15eb7a;
    fs_read_file_eof_cold_1();
LAB_0015eb7a:
    puStack_3d8 = (uv_fs_t *)0x15eb7f;
    fs_read_file_eof_cold_2();
LAB_0015eb7f:
    puStack_3d8 = (uv_fs_t *)0x15eb84;
    fs_read_file_eof_cold_3();
LAB_0015eb84:
    puStack_3d8 = (uv_fs_t *)0x15eb89;
    fs_read_file_eof_cold_4();
LAB_0015eb89:
    puStack_3d8 = (uv_fs_t *)0x15eb8e;
    fs_read_file_eof_cold_5();
LAB_0015eb8e:
    puStack_3d8 = (uv_fs_t *)0x15eb93;
    fs_read_file_eof_cold_6();
LAB_0015eb93:
    puStack_3d8 = (uv_fs_t *)0x15eb98;
    fs_read_file_eof_cold_7();
LAB_0015eb98:
    puStack_3d8 = (uv_fs_t *)0x15eb9d;
    fs_read_file_eof_cold_8();
LAB_0015eb9d:
    puStack_3d8 = (uv_fs_t *)0x15eba2;
    fs_read_file_eof_cold_9();
LAB_0015eba2:
    puStack_3d8 = (uv_fs_t *)0x15eba7;
    fs_read_file_eof_cold_10();
LAB_0015eba7:
    puStack_3d8 = (uv_fs_t *)0x15ebac;
    fs_read_file_eof_cold_11();
LAB_0015ebac:
    puStack_3d8 = (uv_fs_t *)0x15ebb1;
    fs_read_file_eof_cold_12();
LAB_0015ebb1:
    puStack_3d8 = (uv_fs_t *)0x15ebb6;
    fs_read_file_eof_cold_13();
LAB_0015ebb6:
    puStack_3d8 = (uv_fs_t *)0x15ebbb;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015eb7a;
    puStack_3d8 = (uv_fs_t *)0x15e93f;
    uv_fs_req_cleanup(&open_req1);
    puStack_3d8 = (uv_fs_t *)0x15e950;
    uVar15 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x15e98e;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015eb7f;
    if (write_req.result < 0) goto LAB_0015eb84;
    puStack_3d8 = (uv_fs_t *)0x15e9b0;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x15e9c6;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015eb89;
    if (close_req.result != 0) goto LAB_0015eb8e;
    puStack_3d8 = (uv_fs_t *)0x15e9e8;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x15ea05;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015eb93;
    if (open_req1.result._4_4_ < 0) goto LAB_0015eb98;
    puStack_3d8 = (uv_fs_t *)0x15ea27;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_3d8 = (uv_fs_t *)0x15ea49;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x15ea87;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_0015eb9d;
    if (read_req.result < 0) goto LAB_0015eba2;
    iVar4 = 0x3120e0;
    puStack_3d8 = (uv_fs_t *)0x15eab0;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_0015eba7;
    puVar9 = &read_req;
    puStack_3d8 = (uv_fs_t *)0x15eac7;
    uv_fs_req_cleanup(&read_req);
    puStack_3d8 = (uv_fs_t *)0x15ead8;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x15eb12;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,read_req.result,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015ebac;
    if (read_req.result != 0) goto LAB_0015ebb1;
    puStack_3d8 = (uv_fs_t *)0x15eb34;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x15eb4a;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015ebb6;
    if (close_req.result == 0) {
      puStack_3d8 = (uv_fs_t *)0x15eb64;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  puStack_3d8 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_3e0 = (uv_fs_t *)0x15ebc6;
  puStack_3d8 = puVar9;
  fs_write_multiple_bufs(iVar4);
  puStack_3e0 = (uv_fs_t *)0x15ebcb;
  fs_write_multiple_bufs(iVar4);
  puStack_3e0 = (uv_fs_t *)0x15ebd0;
  puVar5 = uv_default_loop();
  puStack_3e0 = (uv_fs_t *)0x15ebe4;
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  puStack_3e0 = (uv_fs_t *)0x15ebee;
  uv_run(puVar5,UV_RUN_DEFAULT);
  puStack_3e0 = (uv_fs_t *)0x15ebf3;
  puVar6 = uv_default_loop();
  puStack_3e0 = (uv_fs_t *)0x15ebfb;
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    puStack_3e0 = (uv_fs_t *)0x15ec04;
    uv_library_shutdown();
    return;
  }
  puStack_3e0 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_3e8 = puVar5;
  puStack_3e0 = unaff_R14;
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_0015f0a0:
    fs_write_multiple_bufs_cold_2();
LAB_0015f0a5:
    fs_write_multiple_bufs_cold_3();
LAB_0015f0aa:
    fs_write_multiple_bufs_cold_4();
LAB_0015f0af:
    fs_write_multiple_bufs_cold_5();
LAB_0015f0b4:
    fs_write_multiple_bufs_cold_6();
LAB_0015f0b9:
    fs_write_multiple_bufs_cold_7();
LAB_0015f0be:
    fs_write_multiple_bufs_cold_8();
LAB_0015f0c3:
    fs_write_multiple_bufs_cold_9();
LAB_0015f0c8:
    fs_write_multiple_bufs_cold_10();
LAB_0015f0cd:
    fs_write_multiple_bufs_cold_11();
LAB_0015f0d2:
    fs_write_multiple_bufs_cold_12();
LAB_0015f0d7:
    fs_write_multiple_bufs_cold_13();
LAB_0015f0dc:
    fs_write_multiple_bufs_cold_14();
LAB_0015f0e1:
    fs_write_multiple_bufs_cold_15();
LAB_0015f0e6:
    fs_write_multiple_bufs_cold_16();
LAB_0015f0eb:
    fs_write_multiple_bufs_cold_19();
LAB_0015f0f0:
    fs_write_multiple_bufs_cold_20();
LAB_0015f0f5:
    fs_write_multiple_bufs_cold_21();
LAB_0015f0fa:
    fs_write_multiple_bufs_cold_22();
LAB_0015f0ff:
    fs_write_multiple_bufs_cold_23();
LAB_0015f104:
    fs_write_multiple_bufs_cold_24();
LAB_0015f109:
    fs_write_multiple_bufs_cold_25();
LAB_0015f10e:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015f0a0;
    uv_fs_req_cleanup(&open_req1);
    uStack_410 = uv_buf_init(test_buf,0xd);
    uStack_400 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&uStack_410,2,0,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f0a5;
    if (write_req.result < 0) goto LAB_0015f0aa;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015f0af;
    if (close_req.result != 0) goto LAB_0015f0b4;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f0b9;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f0be;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_410 = uv_buf_init(buf,0xd);
    uStack_400 = uv_buf_init(buf2,0xf);
    iVar2 = (uv_file)open_req1.result;
    _Var7 = lseek64((uv_file)open_req1.result,0,1);
    if (_Var7 != 0) goto LAB_0015f0c3;
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_410,2,-1,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f0c8;
    if (read_req.result != 0x1c) goto LAB_0015f0cd;
    iVar2 = 0x3120e0;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015f0d2;
    iVar2 = 0x3140d0;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_0015f0d7;
    uv_fs_req_cleanup(&read_req);
    uVar15 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 != 0) goto LAB_0015f0dc;
    if (read_req.result != 0) goto LAB_0015f0e1;
    uv_fs_req_cleanup(&read_req);
    uStack_410 = uv_buf_init(buf,0xd);
    uStack_400 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_410,2,0,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f0e6;
    if (read_req.result == 0x1c) {
LAB_0015ef9e:
      iVar2 = 0x3120e0;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_0015f0eb;
      iVar2 = 0x3140d0;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_0015f0f0;
      uv_fs_req_cleanup(&read_req);
      uVar15 = uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar15;
      iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0x1c,
                         (uv_fs_cb)0x0);
      if (iVar4 != 0) goto LAB_0015f0f5;
      if (read_req.result != 0) goto LAB_0015f0fa;
      uv_fs_req_cleanup(&read_req);
      iVar2 = 0;
      iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar4 != 0) goto LAB_0015f0ff;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_0015f104;
    }
    if (read_req.result != 0xd) goto LAB_0015f109;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_400,1,
                       read_req.result,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f10e;
    if (read_req.result == 0xf) goto LAB_0015ef9e;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_0015f495:
    fs_write_alotof_bufs_cold_18();
LAB_0015f49a:
    fs_write_alotof_bufs_cold_1();
LAB_0015f49f:
    fs_write_alotof_bufs_cold_2();
LAB_0015f4a4:
    fs_write_alotof_bufs_cold_3();
LAB_0015f4a9:
    fs_write_alotof_bufs_cold_4();
LAB_0015f4ae:
    fs_write_alotof_bufs_cold_17();
LAB_0015f4b3:
    fs_write_alotof_bufs_cold_5();
LAB_0015f4b8:
    fs_write_alotof_bufs_cold_6();
LAB_0015f4bd:
    fs_write_alotof_bufs_cold_7();
LAB_0015f4c2:
    fs_write_alotof_bufs_cold_8();
LAB_0015f4c7:
    fs_write_alotof_bufs_cold_9();
LAB_0015f4cc:
    fs_write_alotof_bufs_cold_10();
LAB_0015f4d1:
    fs_write_alotof_bufs_cold_12();
LAB_0015f4d6:
    fs_write_alotof_bufs_cold_13();
LAB_0015f4db:
    fs_write_alotof_bufs_cold_14();
LAB_0015f4e0:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f49a;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f49f;
    uv_fs_req_cleanup(&open_req1);
    lVar11 = 8;
    do {
      uVar15 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar11 + -8) = uVar15.base;
      *(size_t *)((long)&bufs->base + lVar11) = uVar15.len;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f4a4;
    if (write_req.result != 0xac67d) goto LAB_0015f4a9;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_0015f4ae;
    lVar11 = 8;
    pcVar12 = pcVar8;
    do {
      uVar15 = uv_buf_init(pcVar12,0xd);
      *(char **)((long)bufs + lVar11 + -8) = uVar15.base;
      *(size_t *)((long)&bufs->base + lVar11) = uVar15.len;
      lVar11 = lVar11 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar11 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015f4b3;
    if (close_req.result != 0) goto LAB_0015f4b8;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f4bd;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f4c2;
    uv_fs_req_cleanup(&open_req1);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015f4c7;
    if (read_req.result != 0x3400) goto LAB_0015f4cc;
    lVar11 = 0;
    do {
      pcVar12 = pcVar8 + lVar11;
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      iVar2 = (int)pcVar12;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_0015f495;
      }
      lVar11 = lVar11 + 0xd;
    } while (lVar11 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar8);
    iVar2 = (uv_file)open_req1.result;
    _Var7 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var7 != write_req.result) goto LAB_0015f4d1;
    uVar15 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 != 0) goto LAB_0015f4d6;
    if (read_req.result != 0) goto LAB_0015f4db;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015f4e0;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_498 = (uv_loop_t *)0x15f54e;
  unlink("test_file");
  puStack_498 = (uv_loop_t *)0x15f553;
  loop = uv_default_loop();
  puStack_498 = (uv_loop_t *)0x15f564;
  puVar6 = (uv_loop_t *)malloc(0xd4310);
  if (puVar6 == (uv_loop_t *)0x0) {
LAB_0015f8a9:
    puVar6 = puVar5;
    puStack_498 = (uv_loop_t *)0x15f8ae;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_0015f8ae:
    puStack_498 = (uv_loop_t *)0x15f8b3;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_0015f8b3:
    puStack_498 = (uv_loop_t *)0x15f8b8;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015f8b8:
    puStack_498 = (uv_loop_t *)0x15f8bd;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0015f8bd:
    puStack_498 = (uv_loop_t *)0x15f8c2;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_0015f8c2:
    puStack_498 = (uv_loop_t *)0x15f8c7;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015f8c7:
    puStack_498 = (uv_loop_t *)0x15f8cc;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0015f8cc:
    puStack_498 = (uv_loop_t *)0x15f8d1;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_0015f8d1:
    puStack_498 = (uv_loop_t *)0x15f8d6;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015f8d6:
    puStack_498 = (uv_loop_t *)0x15f8db;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0015f8db:
    puStack_498 = (uv_loop_t *)0x15f8e0;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_0015f8e0:
    puStack_498 = (uv_loop_t *)0x15f8e5;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015f8e5:
    puStack_498 = (uv_loop_t *)0x15f8ea;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0015f8ea:
    puStack_498 = (uv_loop_t *)0x15f8ef;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_0015f8ef:
    puStack_498 = (uv_loop_t *)0x15f8f4;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_498 = (uv_loop_t *)0x15f593;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8ae;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f8b3;
    puStack_498 = (uv_loop_t *)0x15f5b5;
    uv_fs_req_cleanup(&open_req1);
    puStack_498 = (uv_loop_t *)0x15f5c6;
    uVar15 = uv_buf_init("0123456789",10);
    puStack_498 = (uv_loop_t *)0x15f604;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015f8b8;
    if (write_req.result != 10) goto LAB_0015f8bd;
    puStack_498 = (uv_loop_t *)0x15f627;
    uv_fs_req_cleanup(&write_req);
    lVar11 = 8;
    do {
      puStack_498 = (uv_loop_t *)0x15f641;
      uVar15 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar6->handle_queue + lVar11 + -0x18) = uVar15.base;
      *(size_t *)((long)puVar6->handle_queue + lVar11 + -0x10) = uVar15.len;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    puStack_498 = (uv_loop_t *)0x15f682;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar6,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8c2;
    if (write_req.result != 0xac67d) goto LAB_0015f8c7;
    puStack_498 = (uv_loop_t *)0x15f6a7;
    uv_fs_req_cleanup(&write_req);
    puStack_498 = (uv_loop_t *)0x15f6b1;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_0015f8cc;
    lVar11 = 8;
    pcVar12 = pcVar8;
    do {
      puStack_498 = (uv_loop_t *)0x15f6d3;
      uVar15 = uv_buf_init(pcVar12,0xd);
      *(char **)((long)puVar6->handle_queue + lVar11 + -0x18) = uVar15.base;
      *(size_t *)((long)puVar6->handle_queue + lVar11 + -0x10) = uVar15.len;
      lVar11 = lVar11 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar11 != 0xd4318);
    puStack_498 = (uv_loop_t *)0x15f718;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar6,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8d1;
    lVar11 = 0xd;
    if (iVar2 != 0xd) {
      lVar11 = 0x3400;
    }
    if (read_req.result != lVar11) goto LAB_0015f8d6;
    pcVar12 = pcVar8;
    uVar10 = 0;
    do {
      puStack_498 = (uv_loop_t *)0x15f75d;
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      if (iVar4 != 0) {
        puStack_498 = (uv_loop_t *)0x15f8a9;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar5 = puVar6;
        goto LAB_0015f8a9;
      }
      if (iVar2 == 0xd) break;
      pcVar12 = pcVar12 + 0xd;
      bVar1 = uVar10 < 0x3ff;
      uVar10 = uVar10 + 1;
    } while (bVar1);
    puStack_498 = (uv_loop_t *)0x15f78a;
    uv_fs_req_cleanup(&read_req);
    puStack_498 = (uv_loop_t *)0x15f792;
    free(pcVar8);
    puStack_498 = (uv_loop_t *)0x15f7a9;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8db;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_0015f8e0;
    puStack_498 = (uv_loop_t *)0x15f7d9;
    uv_fs_req_cleanup(&stat_req);
    puStack_498 = (uv_loop_t *)0x15f7ea;
    uVar15 = uv_buf_init(buf,0x20);
    puStack_498 = (uv_loop_t *)0x15f82c;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8e5;
    if (read_req.result != 0) goto LAB_0015f8ea;
    puStack_498 = (uv_loop_t *)0x15f84e;
    uv_fs_req_cleanup(&read_req);
    puStack_498 = (uv_loop_t *)0x15f864;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8ef;
    if (close_req.result == 0) {
      puStack_498 = (uv_loop_t *)0x15f882;
      uv_fs_req_cleanup(&close_req);
      puStack_498 = (uv_loop_t *)0x15f88e;
      unlink("test_file");
      free(puVar6);
      return;
    }
  }
  puStack_498 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_498 = puVar6;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_0015fa70;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015fa75;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(acStack_49a,2);
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_0015fa7a;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar2 = uv_loop_close(puVar5);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015fa84;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015fa70:
    run_test_fs_read_dir_cold_2();
LAB_0015fa75:
    run_test_fs_read_dir_cold_3();
LAB_0015fa7a:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_0015fa84:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void open_cb_simple(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_OPEN);
  if (req->result < 0) {
    fprintf(stderr, "async open error: %d\n", (int) req->result);
    ASSERT(0);
  }
  open_cb_count++;
  ASSERT(req->path);
  uv_fs_req_cleanup(req);
}